

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_get_mbs_l
                  (archive *a,archive_mstring *aes,char **p,size_t *length,archive_string_conv *sc)

{
  char *local_48;
  char *pm;
  wchar_t ret;
  wchar_t r;
  archive_string_conv *sc_local;
  size_t *length_local;
  char **p_local;
  archive_mstring *aes_local;
  archive *a_local;
  
  pm._0_4_ = L'\0';
  _ret = sc;
  sc_local = (archive_string_conv *)length;
  length_local = (size_t *)p;
  p_local = (char **)aes;
  aes_local = (archive_mstring *)a;
  if ((aes->aes_set & 1U) == 0) {
    archive_mstring_get_mbs(a,aes,&local_48);
  }
  if (((ulong)p_local[0xc] & 1) == 0) {
    *length_local = 0;
    if (sc_local != (archive_string_conv *)0x0) {
      sc_local->next = (archive_string_conv *)0x0;
    }
  }
  else {
    if (_ret == (archive_string_conv *)0x0) {
      *length_local = (size_t)*p_local;
      if (sc_local != (archive_string_conv *)0x0) {
        sc_local->next = (archive_string_conv *)p_local[1];
      }
      return L'\0';
    }
    pm._0_4_ = archive_strncpy_l((archive_string *)(p_local + 9),*p_local,(size_t)p_local[1],_ret);
    *length_local = (size_t)p_local[9];
    if (sc_local != (archive_string_conv *)0x0) {
      sc_local->next = (archive_string_conv *)p_local[10];
    }
  }
  return (wchar_t)pm;
}

Assistant:

int
archive_mstring_get_mbs_l(struct archive *a, struct archive_mstring *aes,
    const char **p, size_t *length, struct archive_string_conv *sc)
{
	int r, ret = 0;

	(void)r; /* UNUSED */
#if defined(_WIN32) && !defined(__CYGWIN__)
	/*
	 * Internationalization programming on Windows must use Wide
	 * characters because Windows platform cannot make locale UTF-8.
	 */
	if (sc != NULL && (aes->aes_set & AES_SET_WCS) != 0) {
		archive_string_empty(&(aes->aes_mbs_in_locale));
		r = archive_string_append_from_wcs_in_codepage(
		    &(aes->aes_mbs_in_locale), aes->aes_wcs.s,
		    aes->aes_wcs.length, sc);
		if (r == 0) {
			*p = aes->aes_mbs_in_locale.s;
			if (length != NULL)
				*length = aes->aes_mbs_in_locale.length;
			return (0);
		} else if (errno == ENOMEM)
			return (-1);
		else
			ret = -1;
	}
#endif

	/* If there is not an MBS form but there is a WCS or UTF8 form, try converting
	 * with the native locale to be used for translating it to specified
	 * character-set. */
	if ((aes->aes_set & AES_SET_MBS) == 0) {
		const char *pm; /* unused */
		archive_mstring_get_mbs(a, aes, &pm); /* ignore errors, we'll handle it later */
	}
	/* If we already have an MBS form, use it to be translated to
	 * specified character-set. */
	if (aes->aes_set & AES_SET_MBS) {
		if (sc == NULL) {
			/* Conversion is unneeded. */
			*p = aes->aes_mbs.s;
			if (length != NULL)
				*length = aes->aes_mbs.length;
			return (0);
		}
		ret = archive_strncpy_l(&(aes->aes_mbs_in_locale),
		    aes->aes_mbs.s, aes->aes_mbs.length, sc);
		*p = aes->aes_mbs_in_locale.s;
		if (length != NULL)
			*length = aes->aes_mbs_in_locale.length;
	} else {
		*p = NULL;
		if (length != NULL)
			*length = 0;
	}
	return (ret);
}